

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_op.cc
# Opt level: O1

vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_> *
__thiscall
hwtest::pgraph::OpRopAnd::mthds
          (vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
           *__return_storage_ptr__,OpRopAnd *this)

{
  mt19937 *this_00;
  uint32_t uVar1;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *pvVar2;
  SingleMthdTest *this_01;
  result_type rVar3;
  Test *pTVar4;
  initializer_list<hwtest::pgraph::SingleMthdTest_*> __l;
  allocator_type local_e9;
  TestOptions *local_e8;
  SingleMthdTest *local_e0;
  vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>
  *local_d8;
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  SingleMthdTest *local_50;
  Test *local_48;
  Test *local_40;
  Test *local_38;
  
  local_d8 = __return_storage_ptr__;
  this_01 = (SingleMthdTest *)operator_new(0x25950);
  this_00 = &(this->super_Class).rnd;
  local_e0 = this_01;
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"nop","");
  local_e8 = &(this->super_Class).opt;
  uVar1 = (this->super_Class).cls;
  Test::Test((Test *)this_01,local_e8,(uint32_t)rVar3);
  (this_01->super_MthdTest).trapbit = -1;
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_00348698;
  this_01->s_cls = uVar1;
  this_01->s_mthd = 0x100;
  this_01->s_stride = 4;
  this_01->s_num = 1;
  this_01->s_trapbit = -1;
  (this_01->name)._M_dataplus._M_p = (pointer)&(this_01->name).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&this_01->name,local_70,local_70 + local_68);
  (this_01->super_MthdTest).super_StateTest.super_RepeatTest.super_Test._vptr_Test =
       (_func_int **)&PTR__SingleMthdTest_003489c8;
  local_50 = this_01;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,local_e8,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x104;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_90,local_90 + local_88);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348bb8;
  local_48 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"dma_notify","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,local_e8,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x180;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 1;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 1;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_b0,local_b0 + local_a8);
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00349850;
  local_40 = pTVar4;
  pTVar4 = (Test *)operator_new(0x25950);
  rVar3 = std::
          mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          ::operator()(this_00);
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"missing","");
  uVar1 = (this->super_Class).cls;
  Test::Test(pTVar4,local_e8,(uint32_t)rVar3);
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x106) = 0xffffffff;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_00348698;
  *(uint32_t *)(pTVar4[0x1e].rnd._M_x + 0x112) = uVar1;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x894) = 0x200;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x113) = 4;
  *(undefined4 *)((long)pTVar4[0x1e].rnd._M_x + 0x89c) = 3;
  *(undefined4 *)(pTVar4[0x1e].rnd._M_x + 0x114) = 0xffffffff;
  pTVar4[0x1e].rnd._M_x[0x115] = (unsigned_long)(pTVar4[0x1e].rnd._M_x + 0x117);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar4[0x1e].rnd._M_x + 0x115),local_d0,local_d0 + local_c8);
  pvVar2 = local_d8;
  pTVar4->_vptr_Test = (_func_int **)&PTR__SingleMthdTest_0034a6b8;
  __l._M_len = 4;
  __l._M_array = &local_50;
  local_38 = pTVar4;
  std::vector<hwtest::pgraph::SingleMthdTest_*,_std::allocator<hwtest::pgraph::SingleMthdTest_*>_>::
  vector(local_d8,__l,&local_e9);
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return pvVar2;
}

Assistant:

std::vector<SingleMthdTest *> OpRopAnd::mthds() {
	return {
		new MthdNop(opt, rnd(), "nop", -1, cls, 0x100),
		new MthdNotify(opt, rnd(), "notify", 0, cls, 0x104),
		new MthdDmaNotify(opt, rnd(), "dma_notify", 1, cls, 0x180),
		new MthdMissing(opt, rnd(), "missing", -1, cls, 0x200, 3),
	};
}